

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O0

void __thiscall Refal2::CRuleParser::wordAfterDirection(CRuleParser *this)

{
  TVariableTypeTag type;
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  TVariableTypeTag *pTVar4;
  ulong uVar5;
  TVariableName *pTVar6;
  CRuleParser *this_local;
  
  if ((this->super_CQualifierParser).token.type != TT_Word) {
    __assert_fail("token.type == TT_Word",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/RuleParser.cpp"
                  ,0x97,"void Refal2::CRuleParser::wordAfterDirection()");
  }
  while( true ) {
    while( true ) {
      bVar1 = std::__cxx11::string::empty();
      if (((bVar1 ^ 0xff) & 1) == 0) {
        return;
      }
      pcVar3 = (char *)std::__cxx11::string::operator[]
                                 ((ulong)&(this->super_CQualifierParser).token.word);
      bVar2 = CompareNoCase(*pcVar3,'k');
      if (!bVar2) break;
      CFunctionBuilder::AddLeftBracket((CFunctionBuilder *)this);
      (this->super_CQualifierParser).token.position =
           (this->super_CQualifierParser).token.position + 1;
      std::__cxx11::string::erase((ulong)&(this->super_CQualifierParser).token.word,0);
    }
    pTVar4 = (TVariableTypeTag *)
             std::__cxx11::string::operator[]((ulong)&(this->super_CQualifierParser).token.word);
    this->variableTypeTag = *pTVar4;
    uVar5 = std::__cxx11::string::length();
    if (uVar5 < 2) break;
    type = this->variableTypeTag;
    pTVar6 = (TVariableName *)
             std::__cxx11::string::operator[]((ulong)&(this->super_CQualifierParser).token.word);
    CFunctionBuilder::AddVariable((CFunctionBuilder *)this,type,*pTVar6,(CQualifier *)0x0);
    (this->super_CQualifierParser).token.position =
         (this->super_CQualifierParser).token.position + 2;
    std::__cxx11::string::erase((ulong)&(this->super_CQualifierParser).token.word,0);
  }
  this->state = (TState)afterVariableType;
  *(undefined8 *)&this->field_0x1e80 = 0;
  return;
}

Assistant:

void CRuleParser::wordAfterDirection()
{
	assert( token.type == TT_Word );
	while( !token.word.empty() ) {
		if( CompareNoCase( token.word[0], RuleLeftBracketTag ) ) {
			CFunctionBuilder::AddLeftBracket();
			token.position++;
			token.word.erase( 0, 1 );
		} else {
			variableTypeTag = token.word[0];
			if( token.word.length() > 1 ) {
				CFunctionBuilder::AddVariable( variableTypeTag, token.word[1] );
				token.position += 2;
				token.word.erase( 0, 2 );
			} else {
				state = &CRuleParser::afterVariableType;
				return;
			}
		}
	}
}